

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,SecurityPolicy *aSecurityPolicy)

{
  ByteArray *aBytes;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  Interpreter *local_18;
  SecurityPolicy *aSecurityPolicy_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  aSecurityPolicy_local = (SecurityPolicy *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::to_string
            (&local_80,
             (uint)*(ushort *)
                    &(local_18->mContext).mNwkAliases.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::operator+(&local_60,"rotationTime=",&local_80);
  std::operator+(&local_40,&local_60,"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  utils::Hex_abi_cxx11_
            (&local_d0,
             (utils *)&(local_18->mContext).mNwkAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,aBytes);
  std::operator+(&local_b0,"flags=",&local_d0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const SecurityPolicy &aSecurityPolicy)
{
    std::string ret;
    ret += "rotationTime=" + std::to_string(aSecurityPolicy.mRotationTime) + "\n";
    ret += "flags=" + utils::Hex(aSecurityPolicy.mFlags);
    return ret;
}